

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::decodeField
          (JsonCodec *this,Field fieldSchema,Reader fieldValue,Orphanage orphanage,Builder output)

{
  Reader RVar1;
  Field field;
  Field FVar2;
  Type TVar3;
  undefined8 uVar4;
  HandlerBase **ppHVar5;
  bool bVar6;
  Impl *pIVar7;
  Orphan<capnp::DynamicValue> local_1e0;
  RawBrandedSchema *local_1a8;
  undefined8 uStack_1a0;
  SegmentReader *local_198;
  CapTableReader *pCStack_190;
  void *local_188;
  WirePointer *pWStack_180;
  undefined8 local_178;
  int iStack_170;
  undefined4 uStack_16c;
  HandlerBase **local_168;
  Type local_160 [4];
  BuilderArena *local_118;
  CapTableBuilder *pCStack_110;
  HandlerBase **local_108;
  Type TStack_100;
  CapTableReader *pCStack_f0;
  void *local_e8;
  WirePointer *pWStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  Orphan<capnp::DynamicValue> local_c0;
  RawBrandedSchema *local_88;
  undefined8 uStack_80;
  SegmentReader *local_78;
  CapTableReader *pCStack_70;
  void *local_68;
  WirePointer *pWStack_60;
  StructDataBitCount local_58;
  StructPointerCount SStack_54;
  undefined2 uStack_52;
  int iStack_50;
  undefined4 uStack_4c;
  HandlerBase **local_48;
  HandlerBase **handler;
  HandlerBase **local_38;
  HandlerBase **_handler412;
  Type fieldType;
  JsonCodec *this_local;
  Orphanage orphanage_local;
  
  fieldType.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)this;
  __handler412 = StructSchema::Field::getType(&fieldSchema);
  pIVar7 = kj::Own<capnp::JsonCodec::Impl,_std::nullptr_t>::operator->(&this->impl);
  kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::
  find<capnp::StructSchema::Field&>
            ((HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*> *)&handler,
             (Field *)&pIVar7->fieldHandlers);
  local_48 = kj::_::readMaybe<capnp::JsonCodec::HandlerBase*const>
                       ((Maybe<capnp::JsonCodec::HandlerBase_*const_&> *)&handler);
  TVar3 = __handler412;
  RVar1 = fieldValue;
  FVar2 = fieldSchema;
  local_38 = local_48;
  if (local_48 == (HandlerBase **)0x0) {
    memcpy(&local_160[0].field_4,&fieldValue,0x30);
    TVar3 = __handler412;
    local_168 = _handler412;
    local_160[0].baseType = fieldType.baseType;
    local_160[0].listDepth = fieldType.listDepth;
    local_160[0].isImplicitParam = fieldType.isImplicitParam;
    local_160[0].field_3 = fieldType.field_3;
    local_160[0]._6_2_ = fieldType._6_2_;
    RVar1._reader.capTable._0_4_ = (int)local_160[1]._0_8_;
    RVar1._reader.segment = (SegmentReader *)local_160[0].field_4.schema;
    RVar1._reader.capTable._4_4_ = SUB84(local_160[1]._0_8_,4);
    RVar1._reader.data._0_4_ = local_160[1].field_4._0_4_;
    RVar1._reader.data._4_4_ = local_160[1].field_4._4_4_;
    RVar1._reader.pointers._0_4_ = (int)local_160[2]._0_8_;
    RVar1._reader.pointers._4_4_ = SUB84(local_160[2]._0_8_,4);
    RVar1._reader.dataSize = local_160[2].field_4._0_4_;
    RVar1._reader._36_4_ = local_160[2].field_4._4_4_;
    RVar1._reader.nestingLimit = (int)local_160[3]._0_8_;
    RVar1._reader._44_4_ = SUB84(local_160[3]._0_8_,4);
    __handler412 = TVar3;
    bVar6 = isPointerToJsonNull(RVar1,TVar3);
    FVar2 = fieldSchema;
    if (!bVar6) {
      local_1a8 = (RawBrandedSchema *)fieldSchema.parent.super_Schema.raw;
      uStack_1a0._0_4_ = fieldSchema.index;
      uStack_1a0._4_4_ = fieldSchema._12_4_;
      fieldSchema.proto._reader.segment = FVar2.proto._reader.segment;
      local_198 = fieldSchema.proto._reader.segment;
      fieldSchema.proto._reader.capTable = FVar2.proto._reader.capTable;
      pCStack_190 = fieldSchema.proto._reader.capTable;
      fieldSchema.proto._reader.data = FVar2.proto._reader.data;
      local_188 = fieldSchema.proto._reader.data;
      fieldSchema.proto._reader.pointers = FVar2.proto._reader.pointers;
      pWStack_180 = fieldSchema.proto._reader.pointers;
      fieldSchema.proto._reader._32_8_ = FVar2.proto._reader._32_8_;
      local_178._0_4_ = fieldSchema.proto._reader.dataSize;
      local_178._4_2_ = fieldSchema.proto._reader.pointerCount;
      local_178._6_2_ = fieldSchema.proto._reader._38_2_;
      fieldSchema.proto._reader._40_8_ = FVar2.proto._reader._40_8_;
      iStack_170 = fieldSchema.proto._reader.nestingLimit;
      uStack_16c = fieldSchema.proto._reader._44_4_;
      fieldSchema = FVar2;
      decode(&local_1e0,this,fieldValue,__handler412,orphanage);
      FVar2.index = (uint)uStack_1a0;
      FVar2.parent.super_Schema.raw = (Schema)(Schema)local_1a8;
      FVar2._12_4_ = SUB84(uStack_1a0,4);
      FVar2.proto._reader.segment._0_4_ = (int)local_198;
      FVar2.proto._reader.segment._4_4_ = (int)((ulong)local_198 >> 0x20);
      FVar2.proto._reader.capTable._0_4_ = (int)pCStack_190;
      FVar2.proto._reader.capTable._4_4_ = (int)((ulong)pCStack_190 >> 0x20);
      FVar2.proto._reader.data._0_4_ = (int)local_188;
      FVar2.proto._reader.data._4_4_ = (int)((ulong)local_188 >> 0x20);
      FVar2.proto._reader.pointers._0_4_ = (int)pWStack_180;
      FVar2.proto._reader.pointers._4_4_ = (int)((ulong)pWStack_180 >> 0x20);
      FVar2.proto._reader.dataSize = (StructDataBitCount)local_178;
      FVar2.proto._reader.pointerCount = local_178._4_2_;
      FVar2.proto._reader._38_2_ = local_178._6_2_;
      FVar2.proto._reader.nestingLimit = iStack_170;
      FVar2.proto._reader._44_4_ = uStack_16c;
      DynamicStruct::Builder::adopt(&output,FVar2,&local_1e0);
      Orphan<capnp::DynamicValue>::~Orphan(&local_1e0);
    }
  }
  else {
    local_88 = (RawBrandedSchema *)fieldSchema.parent.super_Schema.raw;
    uStack_80._0_4_ = fieldSchema.index;
    uStack_80._4_4_ = fieldSchema._12_4_;
    fieldSchema.proto._reader.segment = FVar2.proto._reader.segment;
    local_78 = fieldSchema.proto._reader.segment;
    fieldSchema.proto._reader.capTable = FVar2.proto._reader.capTable;
    pCStack_70 = fieldSchema.proto._reader.capTable;
    fieldSchema.proto._reader.data = FVar2.proto._reader.data;
    local_68 = fieldSchema.proto._reader.data;
    fieldSchema.proto._reader.pointers = FVar2.proto._reader.pointers;
    pWStack_60 = fieldSchema.proto._reader.pointers;
    fieldSchema.proto._reader.dataSize = FVar2.proto._reader.dataSize;
    local_58 = fieldSchema.proto._reader.dataSize;
    fieldSchema.proto._reader._36_4_ = FVar2.proto._reader._36_4_;
    SStack_54 = fieldSchema.proto._reader.pointerCount;
    uStack_52 = fieldSchema.proto._reader._38_2_;
    fieldSchema.proto._reader.nestingLimit = FVar2.proto._reader.nestingLimit;
    iStack_50 = fieldSchema.proto._reader.nestingLimit;
    fieldSchema.proto._reader._44_4_ = FVar2.proto._reader._44_4_;
    uStack_4c = fieldSchema.proto._reader._44_4_;
    TStack_100.field_4 = (anon_union_8_2_eba6ea51_for_Type_5)fieldValue._reader.segment;
    pCStack_f0 = fieldValue._reader.capTable;
    local_e8 = fieldValue._reader.data;
    pWStack_e0 = fieldValue._reader.pointers;
    local_d8._0_4_ = fieldValue._reader.dataSize;
    local_d8._4_2_ = fieldValue._reader.pointerCount;
    local_d8._6_2_ = fieldValue._reader._38_2_;
    fieldValue._reader._40_8_ = RVar1._reader._40_8_;
    uStack_d0._0_4_ = fieldValue._reader.nestingLimit;
    uStack_d0._4_4_ = fieldValue._reader._44_4_;
    uVar4 = fieldType._0_8_;
    local_108 = _handler412;
    TStack_100.baseType = fieldType.baseType;
    TStack_100.listDepth = fieldType.listDepth;
    TStack_100.isImplicitParam = fieldType.isImplicitParam;
    TStack_100.field_3 = fieldType.field_3;
    TStack_100._6_2_ = fieldType._6_2_;
    fieldSchema = FVar2;
    fieldValue = RVar1;
    local_118 = orphanage.arena;
    pCStack_110 = orphanage.capTable;
    ppHVar5 = _handler412;
    __handler412 = TVar3;
    (*(*local_48)->_vptr_HandlerBase[1])(&local_c0,*local_48,this,ppHVar5,uVar4);
    field.proto._reader.pointerCount = SStack_54;
    field.proto._reader._38_2_ = uStack_52;
    field.proto._reader.dataSize = local_58;
    field.proto._reader._44_4_ = uStack_4c;
    field.proto._reader.nestingLimit = iStack_50;
    field.index = (uint)uStack_80;
    field.parent.super_Schema.raw = (Schema)(Schema)local_88;
    field._12_4_ = SUB84(uStack_80,4);
    field.proto._reader.segment._0_4_ = (int)local_78;
    field.proto._reader.segment._4_4_ = (int)((ulong)local_78 >> 0x20);
    field.proto._reader.capTable._0_4_ = (int)pCStack_70;
    field.proto._reader.capTable._4_4_ = (int)((ulong)pCStack_70 >> 0x20);
    field.proto._reader.data._0_4_ = (int)local_68;
    field.proto._reader.data._4_4_ = (int)((ulong)local_68 >> 0x20);
    field.proto._reader.pointers._0_4_ = (int)pWStack_60;
    field.proto._reader.pointers._4_4_ = (int)((ulong)pWStack_60 >> 0x20);
    DynamicStruct::Builder::adopt(&output,field,&local_c0);
    Orphan<capnp::DynamicValue>::~Orphan(&local_c0);
  }
  return;
}

Assistant:

void JsonCodec::decodeField(StructSchema::Field fieldSchema, JsonValue::Reader fieldValue,
                            Orphanage orphanage, DynamicStruct::Builder output) const {
  auto fieldType = fieldSchema.getType();

  KJ_IF_SOME(handler, impl->fieldHandlers.find(fieldSchema)) {
    output.adopt(fieldSchema, handler->decodeBase(*this, fieldValue, fieldType, orphanage));
  } else {
    if (!isPointerToJsonNull(fieldValue, fieldType)) {
      // If the schema type is a pointer type and the json value is null, we act as if the value
      // doesn't exist.
      output.adopt(fieldSchema, decode(fieldValue, fieldType, orphanage));
    }
  }
}